

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_err_t array_list_init(int init_size,array_list_t *array_list)

{
  ion_fpos_t *piVar1;
  array_list_t *array_list_local;
  int init_size_local;
  
  array_list->current_size = init_size;
  piVar1 = (ion_fpos_t *)malloc((long)init_size << 3);
  array_list->data = piVar1;
  memset(array_list->data,0,(long)init_size << 3);
  if (array_list->data == (ion_fpos_t *)0x0) {
    array_list_local._7_1_ = '\x06';
  }
  else {
    array_list_local._7_1_ = '\0';
  }
  return array_list_local._7_1_;
}

Assistant:

ion_err_t
array_list_init(
	int				init_size,
	array_list_t	*array_list
) {
	array_list->current_size	= init_size;
	array_list->data			= malloc(init_size * sizeof(ion_fpos_t));
	memset(array_list->data, 0, sizeof(ion_fpos_t) * init_size);

	if (NULL == array_list->data) {
		return err_out_of_memory;
	}

	return err_ok;
}